

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  FieldOptions *this_00;
  Descriptor *this_01;
  MessageOptions *this_02;
  Printer *printer_local;
  FieldGeneratorBase *this_local;
  
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::deprecated(this_00);
  if (bVar1) {
    io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
  }
  else {
    TVar2 = FieldDescriptor::type(this->descriptor_);
    if (TVar2 == TYPE_MESSAGE) {
      this_01 = FieldDescriptor::message_type(this->descriptor_);
      this_02 = Descriptor::options(this_01);
      bVar1 = MessageOptions::deprecated(this_02);
      if (bVar1) {
        io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
      }
    }
  }
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}